

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O2

void __thiscall CEffects::PlayerSpawn(CEffects *this,vec2 Pos)

{
  vec2 vVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  float fVar4;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_98;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_94;
  CParticle local_80;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0x20;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_80.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    local_80.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    local_80.m_Rot = 0.0;
    local_80.m_Rotspeed = 0.0;
    local_80.m_Gravity = 0.0;
    local_80.m_Friction = 0.0;
    local_80.m_FlowAffected = 1.0;
    local_80.m_LifeSpan = 0.0;
    local_80.m_StartSize = 32.0;
    local_80.m_EndSize = 32.0;
    local_80.m_Color.field_0.x = 1.0;
    local_80.m_Color.field_1.y = 1.0;
    local_80.m_Color.field_2.z = 1.0;
    local_80.m_Color.field_3.w = 1.0;
    local_80.m_Spr = 6;
    local_80.m_Pos = Pos;
    vVar1 = RandomDir();
    fVar4 = random_float();
    fVar4 = powf(fVar4,3.0);
    local_98 = vVar1.field_0;
    aStack_94 = vVar1.field_1;
    local_80.m_Vel.field_1.y = fVar4 * 600.0 * aStack_94.y;
    local_80.m_Vel.field_0.x = fVar4 * 600.0 * local_98.x;
    fVar4 = random_float();
    local_80.m_LifeSpan = fVar4 * 0.3 + 0.3;
    fVar4 = random_float();
    local_80.m_EndSize = 0.0;
    local_80.m_StartSize = fVar4 * 32.0 + 64.0;
    fVar4 = random_float();
    local_80.m_Rot = fVar4 * 3.1415927 + fVar4 * 3.1415927;
    fVar4 = random_float();
    local_80.m_Rotspeed = fVar4;
    local_80.m_Gravity = random_float();
    local_80.m_Gravity = local_80.m_Gravity * -400.0;
    local_80.m_Friction = 0.7;
    local_80.m_Color.field_0.x = 0.70980394;
    local_80.m_Color.field_1.y = 0.3137255;
    local_80.m_Color.field_2.z = 0.79607844;
    local_80.m_Color.field_3.w = 1.0;
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,2,&local_80);
  }
  CSounds::PlayAt(((this->super_CComponent).m_pClient)->m_pSounds,2,0x11,1.0,Pos);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::PlayerSpawn(vec2 Pos)
{
	for(int i = 0; i < 32; i++)
	{
		CParticle p;
		p.SetDefault();
		p.m_Spr = SPRITE_PART_SHELL;
		p.m_Pos = Pos;
		p.m_Vel = RandomDir() * (powf(random_float(), 3)*600.0f);
		p.m_LifeSpan = 0.3f + random_float()*0.3f;
		p.m_StartSize = 64.0f + random_float()*32;
		p.m_EndSize = 0;
		p.m_Rot = random_float()*pi*2;
		p.m_Rotspeed = random_float();
		p.m_Gravity = random_float()*-400.0f;
		p.m_Friction = 0.7f;
		p.m_Color = vec4(0xb5/255.0f, 0x50/255.0f, 0xcb/255.0f, 1.0f);
		m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);

	}
	m_pClient->m_pSounds->PlayAt(CSounds::CHN_WORLD, SOUND_PLAYER_SPAWN, 1.0f, Pos);
}